

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O2

ScanVectorType __thiscall
duckdb::StandardColumnData::GetVectorScanType
          (StandardColumnData *this,ColumnScanState *state,idx_t scan_count,Vector *result)

{
  ScanVectorType SVar1;
  reference state_00;
  
  SVar1 = ColumnData::GetVectorScanType(&this->super_ColumnData,state,scan_count,result);
  if (SVar1 == SCAN_ENTIRE_VECTOR) {
    if ((state->child_states).
        super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
        super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (state->child_states).
        super_vector<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
        super__Vector_base<duckdb::ColumnScanState,_std::allocator<duckdb::ColumnScanState>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      state_00 = vector<duckdb::ColumnScanState,_true>::get<true>(&state->child_states,0);
      SVar1 = ColumnData::GetVectorScanType
                        (&(this->validity).super_ColumnData,state_00,scan_count,result);
      return SVar1;
    }
    SVar1 = SCAN_ENTIRE_VECTOR;
  }
  else {
    SVar1 = SCAN_FLAT_VECTOR;
  }
  return SVar1;
}

Assistant:

ScanVectorType StandardColumnData::GetVectorScanType(ColumnScanState &state, idx_t scan_count, Vector &result) {
	// if either the current column data, or the validity column data requires flat vectors, we scan flat vectors
	auto scan_type = ColumnData::GetVectorScanType(state, scan_count, result);
	if (scan_type == ScanVectorType::SCAN_FLAT_VECTOR) {
		return ScanVectorType::SCAN_FLAT_VECTOR;
	}
	if (state.child_states.empty()) {
		return scan_type;
	}
	return validity.GetVectorScanType(state.child_states[0], scan_count, result);
}